

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QueryOptimizer.cpp
# Opt level: O2

Query * deduplicate_primitives(Query *__return_storage_ptr__,Query *q,bool *changed)

{
  pointer pQVar1;
  Query *pQVar2;
  QueryType *pQVar3;
  vector<Query,_std::allocator<Query>_> *pvVar4;
  size_type sVar5;
  Query *query;
  pointer this;
  vector<Query,_std::allocator<Query>_> newqueries;
  set<PrimitiveQuery,_std::less<PrimitiveQuery>,_std::allocator<PrimitiveQuery>_> seen;
  vector<Query,_std::allocator<Query>_> local_d8;
  Query *local_b8;
  Query *local_b0;
  _Rb_tree<PrimitiveQuery,_PrimitiveQuery,_std::_Identity<PrimitiveQuery>,_std::less<PrimitiveQuery>,_std::allocator<PrimitiveQuery>_>
  local_a8;
  Query local_78;
  
  pQVar3 = Query::get_type(q);
  if ((*pQVar3 != AND) && (pQVar3 = Query::get_type(q), *pQVar3 != OR)) {
    Query::Query(__return_storage_ptr__,q);
    return __return_storage_ptr__;
  }
  local_a8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_a8._M_impl.super__Rb_tree_header._M_header;
  local_a8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_a8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_a8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_d8.super__Vector_base<Query,_std::allocator<Query>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_d8.super__Vector_base<Query,_std::allocator<Query>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_d8.super__Vector_base<Query,_std::allocator<Query>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_b8 = __return_storage_ptr__;
  local_b0 = q;
  local_a8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_a8._M_impl.super__Rb_tree_header._M_header._M_left;
  pvVar4 = Query::as_queries(q);
  pQVar1 = (pvVar4->super__Vector_base<Query,_std::allocator<Query>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (this = (pvVar4->super__Vector_base<Query,_std::allocator<Query>_>)._M_impl.
              super__Vector_impl_data._M_start; this != pQVar1; this = this + 1) {
    pQVar3 = Query::get_type(this);
    if (*pQVar3 == PRIMITIVE) {
      local_78._0_8_ = Query::as_ngram(this);
      sVar5 = std::set<PrimitiveQuery,_std::less<PrimitiveQuery>,_std::allocator<PrimitiveQuery>_>::
              count((set<PrimitiveQuery,_std::less<PrimitiveQuery>,_std::allocator<PrimitiveQuery>_>
                     *)&local_a8,(key_type *)&local_78);
      if (sVar5 == 0) {
        std::vector<Query,_std::allocator<Query>_>::emplace_back<Query>(&local_d8,this);
        local_78._0_8_ = Query::as_ngram(this);
        std::
        _Rb_tree<PrimitiveQuery,_PrimitiveQuery,_std::_Identity<PrimitiveQuery>,_std::less<PrimitiveQuery>,_std::allocator<PrimitiveQuery>_>
        ::_M_insert_unique<PrimitiveQuery>(&local_a8,(PrimitiveQuery *)&local_78);
      }
      else {
        *changed = true;
      }
    }
    else {
      std::vector<Query,_std::allocator<Query>_>::emplace_back<Query>(&local_d8,this);
    }
  }
  pQVar3 = Query::get_type(local_b0);
  Query::Query(&local_78,pQVar3,&local_d8);
  pQVar2 = local_b8;
  Query::Query(local_b8,&local_78);
  Query::~Query(&local_78);
  std::vector<Query,_std::allocator<Query>_>::~vector(&local_d8);
  std::
  _Rb_tree<PrimitiveQuery,_PrimitiveQuery,_std::_Identity<PrimitiveQuery>,_std::less<PrimitiveQuery>,_std::allocator<PrimitiveQuery>_>
  ::~_Rb_tree(&local_a8);
  return pQVar2;
}

Assistant:

Query deduplicate_primitives(Query &&q, bool *changed) {
    if (q.get_type() != QueryType::AND && q.get_type() != QueryType::OR) {
        return std::move(q);
    }

    std::set<PrimitiveQuery> seen;
    std::vector<Query> newqueries;
    for (auto &&query : q.as_queries()) {
        if (query.get_type() != QueryType::PRIMITIVE) {
            newqueries.emplace_back(std::move(query));
        } else if (seen.count(query.as_ngram()) == 0) {
            newqueries.emplace_back(std::move(query));
            seen.insert(query.as_ngram());
        } else {
            *changed = true;
        }
    }
    return std::move(Query(q.get_type(), std::move(newqueries)));
}